

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

type __thiscall
cm::String::replace<char_const(&)[3]>
          (String *this,const_iterator first,const_iterator last,char (*s) [3])

{
  type pSVar1;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::reserve((ulong)&local_48);
  std::__cxx11::string::replace
            ((ulong)&local_48,local_48._M_string_length,(char *)0x0,(ulong)(this->view_)._M_str);
  std::__cxx11::string::append((char *)&local_48,(ulong)s);
  std::__cxx11::string::replace((ulong)&local_48,local_48._M_string_length,(char *)0x0,(ulong)last);
  pSVar1 = operator=(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return pSVar1;
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type replace(
    const_iterator first, const_iterator last, T&& s)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    std::string out;
    out.reserve((first - this->view_.begin()) + v.size() +
                (this->view_.end() - last));
    out.append(this->view_.begin(), first);
    out.append(v.data(), v.size());
    out.append(last, this->view_.end());
    return *this = std::move(out);
  }